

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

void phosg::print_log_prefix(FILE *stream,LogLevel level)

{
  char cVar1;
  uint uVar2;
  const_reference pvVar3;
  undefined1 local_78 [7];
  char level_char;
  tm now_tm;
  time_t now_secs;
  char time_buffer [32];
  LogLevel level_local;
  FILE *stream_local;
  
  time_buffer._28_4_ = level;
  now_tm.tm_zone = (char *)time((time_t *)0x0);
  localtime_r((time_t *)&now_tm.tm_zone,(tm *)local_78);
  strftime((char *)&now_secs,0x20,"%Y-%m-%d %H:%M:%S",(tm *)local_78);
  pvVar3 = ::std::vector<char,_std::allocator<char>_>::at
                     ((vector<char,_std::allocator<char>_> *)log_level_chars,
                      (long)(int)time_buffer._28_4_);
  cVar1 = *pvVar3;
  uVar2 = getpid_cached();
  fprintf((FILE *)stream,"%c %d %s - ",(ulong)(uint)(int)cVar1,(ulong)uVar2,&now_secs);
  return;
}

Assistant:

void print_log_prefix(FILE* stream, LogLevel level) {
  char time_buffer[32];
  time_t now_secs = time(nullptr);
  struct tm now_tm;
  localtime_r(&now_secs, &now_tm);
  strftime(time_buffer, sizeof(time_buffer), "%Y-%m-%d %H:%M:%S", &now_tm);
  char level_char = log_level_chars.at(static_cast<int>(level));
  fprintf(stream, "%c %d %s - ", level_char, getpid_cached(), time_buffer);
}